

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_remove_from_jmp_list(TranslationBlock_conflict *orig,int n_orig)

{
  uintptr_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uintptr_t *puVar5;
  TranslationBlock_conflict *pTVar6;
  bool bVar7;
  
  uVar4 = orig->jmp_dest[(uint)n_orig];
  do {
    LOCK();
    uVar2 = orig->jmp_dest[(uint)n_orig];
    bVar7 = uVar4 == uVar2;
    if (bVar7) {
      orig->jmp_dest[(uint)n_orig] = uVar4 | 1;
      uVar2 = uVar4;
    }
    UNLOCK();
    uVar4 = uVar2;
  } while (!bVar7);
  uVar4 = uVar2 & 0xfffffffffffffffe;
  if (uVar4 != 0) {
    if (orig->jmp_dest[(uint)n_orig] == (uVar2 | 1)) {
      puVar1 = (uintptr_t *)(uVar4 + 0x68);
      do {
        puVar5 = puVar1;
        uVar4 = *puVar5;
        pTVar6 = (TranslationBlock_conflict *)(uVar4 & 0xfffffffffffffffe);
        if (pTVar6 == (TranslationBlock_conflict *)0x0) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                     ,0x5b0,(char *)0x0);
        }
        uVar3 = (uint)uVar4 & 1;
        puVar1 = pTVar6->jmp_list_next + uVar3;
      } while (uVar3 != n_orig || pTVar6 != orig);
      *puVar5 = pTVar6->jmp_list_next[uVar3];
    }
    else if ((orig->jmp_dest[(uint)n_orig] != 1) || ((*(byte *)(uVar4 + 0x12) & 4) == 0)) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                 ,0x5a0,"ptr_locked == 1 && dest->cflags & CF_INVALID");
    }
  }
  return;
}

Assistant:

static inline void tb_remove_from_jmp_list(TranslationBlock *orig, int n_orig)
{
    uintptr_t ptr, ptr_locked;
    TranslationBlock *dest;
    TranslationBlock *tb;
    uintptr_t *pprev;
    int n;

    /* mark the LSB of jmp_dest[] so that no further jumps can be inserted */
    ptr = atomic_or_fetch(&orig->jmp_dest[n_orig], 1);
    dest = (TranslationBlock *)(ptr & ~1);
    if (dest == NULL) {
        return;
    }

    ptr_locked = orig->jmp_dest[n_orig];
    if (ptr_locked != ptr) {
        /*
         * The only possibility is that the jump was unlinked via
         * tb_jump_unlink(dest). Seeing here another destination would be a bug,
         * because we set the LSB above.
         */
        g_assert(ptr_locked == 1 && dest->cflags & CF_INVALID);
        return;
    }
    /*
     * We first acquired the lock, and since the destination pointer matches,
     * we know for sure that @orig is in the jmp list.
     */
    pprev = &dest->jmp_list_head;
    TB_FOR_EACH_JMP(dest, tb, n) {
        if (tb == orig && n == n_orig) {
            *pprev = tb->jmp_list_next[n];
            /* no need to set orig->jmp_dest[n]; setting the LSB was enough */
            return;
        }
        pprev = &tb->jmp_list_next[n];
    }
    g_assert_not_reached();
}